

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_derivative.cpp
# Opt level: O1

Interval1f __thiscall
embree::motion_derivative_regression_test::run::EvalFunc::operator()(EvalFunc *this,Interval1f *t)

{
  Interval1f IVar1;
  double dVar2;
  undefined8 *in_RDX;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float local_78;
  
  fVar22 = (float)*in_RDX;
  fVar3 = fVar22 * 5.438017;
  fVar14 = (float)((ulong)*in_RDX >> 0x20);
  fVar9 = fVar14 * 5.438017;
  local_78 = fVar9;
  if (fVar9 <= fVar3) {
    local_78 = fVar3;
    fVar3 = fVar9;
  }
  fVar9 = -1.0;
  fVar4 = 1.0;
  if (local_78 - fVar3 < 3.1415927) {
    if (6.283185307179586 < (double)local_78) {
      dVar2 = floor((double)local_78 / 6.283185307179586);
      fVar3 = fVar3 + (float)(dVar2 * -6.283185307179586);
      local_78 = local_78 + (float)(dVar2 * -6.283185307179586);
    }
    if (fVar3 < 0.0) {
      dVar2 = floor((double)fVar3 / 6.283185307179586);
      fVar3 = fVar3 + (float)(dVar2 * -6.283185307179586);
      local_78 = local_78 + (float)(dVar2 * -6.283185307179586);
    }
    fVar4 = cosf(fVar3);
    fVar5 = cosf(local_78);
    fVar17 = fVar5;
    if (fVar4 <= fVar5) {
      fVar17 = fVar4;
    }
    fVar9 = fVar17;
    if (3.1415927 < local_78) {
      fVar9 = -1.0;
    }
    if (3.1415927 <= fVar3) {
      fVar9 = fVar17;
    }
    if (fVar4 <= fVar5) {
      fVar4 = fVar5;
    }
  }
  fVar17 = 1.0;
  fVar3 = (float)*in_RDX;
  fVar21 = (float)((ulong)*in_RDX >> 0x20);
  fVar5 = fVar3 * 5.438017;
  fVar10 = fVar21 * 5.438017;
  uVar12 = (int)((uint)(fVar5 < fVar10) << 0x1f) >> 0x1f;
  uVar15 = (int)((uint)(fVar5 < fVar10) << 0x1f) >> 0x1f;
  fVar13 = (float)(~uVar12 & (uint)fVar10 | (uint)fVar5 & uVar12);
  fVar10 = (float)(~uVar15 & (uint)fVar5 | (uint)fVar10 & uVar15);
  fVar5 = -1.0;
  if (fVar10 - fVar13 < 3.1415927) {
    if (6.283185307179586 < (double)fVar10) {
      dVar2 = floor((double)fVar10 / 6.283185307179586);
      fVar13 = fVar13 + (float)(dVar2 * -6.283185307179586);
      fVar10 = fVar10 + (float)(dVar2 * -6.283185307179586);
    }
    if (fVar13 < 0.0) {
      dVar2 = floor((double)fVar13 / 6.283185307179586);
      fVar13 = fVar13 + (float)(dVar2 * -6.283185307179586);
      fVar10 = fVar10 + (float)(dVar2 * -6.283185307179586);
    }
    fVar6 = sinf(fVar13);
    fVar7 = sinf(fVar10);
    fVar5 = fVar6;
    if (fVar6 <= fVar7) {
      fVar5 = fVar7;
    }
    fVar17 = fVar5;
    if (fVar13 < 1.5707964) {
      fVar17 = 1.0;
    }
    if (fVar10 <= 1.5707964) {
      fVar17 = fVar5;
    }
    if (fVar6 <= fVar7) {
      fVar7 = fVar6;
    }
    fVar5 = fVar7;
    if (fVar13 < 4.712389) {
      fVar5 = -1.0;
    }
    if (fVar10 <= 4.712389) {
      fVar5 = fVar7;
    }
  }
  fVar13 = fVar3 * 786.18195;
  fVar7 = fVar21 * 786.18195;
  fVar10 = fVar7;
  if (fVar7 <= fVar13) {
    fVar10 = fVar13;
  }
  fVar11 = fVar3 * -559.99316;
  fVar6 = fVar21 * -559.99316;
  fVar18 = fVar11;
  if (fVar6 <= fVar11) {
    fVar18 = fVar6;
  }
  fVar8 = fVar3 * fVar18;
  fVar18 = fVar18 * fVar21;
  fVar19 = fVar18;
  if (fVar18 <= fVar8) {
    fVar19 = fVar8;
  }
  if (fVar6 <= fVar11) {
    fVar6 = fVar11;
  }
  fVar3 = fVar3 * fVar6;
  fVar6 = fVar6 * fVar21;
  fVar11 = fVar6;
  if (fVar6 <= fVar3) {
    fVar11 = fVar3;
  }
  if (fVar11 <= fVar19) {
    fVar11 = fVar19;
  }
  fVar11 = fVar11 + fVar10 + -320.57147;
  if (fVar7 <= fVar13) {
    fVar13 = fVar7;
  }
  if (fVar18 <= fVar8) {
    fVar8 = fVar18;
  }
  if (fVar6 <= fVar3) {
    fVar3 = fVar6;
  }
  if (fVar3 <= fVar8) {
    fVar8 = fVar3;
  }
  fVar8 = fVar8 + fVar13 + -320.57147;
  fVar13 = fVar22 * -116.007454;
  fVar7 = fVar14 * -116.007454;
  fVar6 = fVar22 * 411.19305;
  fVar10 = fVar14 * 411.19305;
  fVar3 = fVar6;
  if (fVar10 <= fVar6) {
    fVar3 = fVar10;
  }
  fVar16 = fVar22 * -160.02002;
  fVar18 = fVar14 * -160.02002;
  fVar19 = fVar16;
  if (fVar18 <= fVar16) {
    fVar19 = fVar18;
  }
  fVar20 = fVar22 * fVar19;
  fVar19 = fVar19 * fVar14;
  if (fVar18 <= fVar16) {
    fVar18 = fVar16;
  }
  fVar16 = fVar20;
  if (fVar19 <= fVar20) {
    fVar16 = fVar19;
  }
  fVar22 = fVar22 * fVar18;
  fVar18 = fVar18 * fVar14;
  fVar14 = fVar22;
  if (fVar18 <= fVar22) {
    fVar14 = fVar18;
  }
  if (fVar14 <= fVar16) {
    fVar16 = fVar14;
  }
  fVar16 = fVar16 + fVar3 + -198.23581;
  if (fVar10 <= fVar6) {
    fVar10 = fVar6;
  }
  if (fVar19 <= fVar20) {
    fVar19 = fVar20;
  }
  if (fVar18 <= fVar22) {
    fVar18 = fVar22;
  }
  fVar3 = fVar7;
  if (fVar7 <= fVar13) {
    fVar3 = fVar13;
  }
  if (fVar18 <= fVar19) {
    fVar18 = fVar19;
  }
  fVar22 = fVar16 * fVar9;
  fVar16 = fVar16 * fVar4;
  fVar18 = fVar18 + fVar10 + -198.23581;
  fVar14 = fVar16;
  if (fVar16 <= fVar22) {
    fVar14 = fVar22;
  }
  fVar9 = fVar9 * fVar18;
  fVar18 = fVar18 * fVar4;
  fVar4 = fVar18;
  if (fVar18 <= fVar9) {
    fVar4 = fVar9;
  }
  if (fVar4 <= fVar14) {
    fVar4 = fVar14;
  }
  if (fVar7 <= fVar13) {
    fVar13 = fVar7;
  }
  if (fVar16 <= fVar22) {
    fVar22 = fVar16;
  }
  if (fVar18 <= fVar9) {
    fVar9 = fVar18;
  }
  if (fVar9 <= fVar22) {
    fVar22 = fVar9;
  }
  fVar14 = fVar8 * fVar5;
  fVar8 = fVar8 * fVar17;
  fVar5 = fVar5 * fVar11;
  fVar11 = fVar11 * fVar17;
  fVar9 = fVar14;
  if (fVar8 <= fVar14) {
    fVar9 = fVar8;
  }
  fVar17 = fVar5;
  if (fVar11 <= fVar5) {
    fVar17 = fVar11;
  }
  if (fVar17 <= fVar9) {
    fVar9 = fVar17;
  }
  if (fVar8 <= fVar14) {
    fVar8 = fVar14;
  }
  if (fVar11 <= fVar5) {
    fVar11 = fVar5;
  }
  if (fVar11 <= fVar8) {
    fVar11 = fVar8;
  }
  *(float *)this = fVar9 + fVar22 + fVar13 + 62.787994;
  *(float *)(this + 4) = fVar11 + fVar4 + fVar3 + 62.787994;
  IVar1.upper = fVar21;
  IVar1.lower = fVar8;
  return IVar1;
}

Assistant:

Interval1f operator()(Interval1f const& t) const {
          return (t - 1.0f) * (t + 1.0f) * (t + 0.99999f);
        }